

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.cpp
# Opt level: O0

mbedtls_cipher_info_t * mbedtls_cipher_info_from_string(char *cipher_name)

{
  int iVar1;
  char *in_RDI;
  mbedtls_cipher_definition_t *def;
  mbedtls_cipher_definition_t *local_18;
  
  if (in_RDI != (char *)0x0) {
    for (local_18 = mbedtls_cipher_definitions; local_18->info != (mbedtls_cipher_info_t *)0x0;
        local_18 = local_18 + 1) {
      iVar1 = strcmp(local_18->info->name,in_RDI);
      if (iVar1 == 0) {
        return local_18->info;
      }
    }
  }
  return (mbedtls_cipher_info_t *)0x0;
}

Assistant:

const mbedtls_cipher_info_t *mbedtls_cipher_info_from_string(
    const char *cipher_name)
{
    const mbedtls_cipher_definition_t *def;

    if (NULL == cipher_name) {
        return NULL;
    }

    for (def = mbedtls_cipher_definitions; def->info != NULL; def++) {
        if (!strcmp(def->info->name, cipher_name)) {
            return def->info;
        }
    }

    return NULL;
}